

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O3

void __thiscall
cmCTestMemCheckHandler::GenerateCTestXML(cmCTestMemCheckHandler *this,cmXMLWriter *xml)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pcVar4;
  cmCTest *pcVar5;
  pointer pbVar6;
  cmXMLWriter *pcVar7;
  bool bVar8;
  int iVar9;
  long *plVar10;
  long lVar11;
  ostream *poVar12;
  pointer piVar13;
  size_type *psVar14;
  pointer piVar15;
  char *pcVar16;
  cmCTestMemCheckHandler *pcVar17;
  int iVar18;
  pointer pcVar19;
  ulong uVar20;
  string output;
  string outname;
  vector<int,_std::allocator<int>_> memcheckresults;
  string testPath;
  string local_248;
  cmCTestMemCheckHandler *local_228;
  string local_220;
  cmXMLWriter *local_200;
  cmCTestTestResult *local_1f8;
  ulong local_1f0;
  vector<int,_std::allocator<int>_> local_1e8;
  undefined1 local_1d0 [112];
  ios_base local_160 [264];
  long local_58;
  long *local_50;
  long local_40 [2];
  
  bVar8 = cmCTest::GetProduceXML((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest)
  ;
  if (!bVar8) {
    return;
  }
  cmCTest::StartXML((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,xml,
                    (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.AppendXML);
  cmCTest::GenerateSubprojectsOutput
            ((this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,xml);
  pcVar4 = local_1d0 + 0x10;
  local_1d0._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"DynamicAnalysis","");
  cmXMLWriter::StartElement(xml,(string *)local_1d0);
  if ((pointer)local_1d0._0_8_ != pcVar4) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  switch(this->MemoryTesterStyle) {
  case 1:
    pcVar16 = "Valgrind";
    goto LAB_001adc76;
  case 2:
    cmXMLWriter::Attribute<char[7]>(xml,"Checker",(char (*) [7])0x73c61e);
    break;
  case 3:
    pcVar16 = "DrMemory";
LAB_001adc76:
    cmXMLWriter::Attribute<char[9]>(xml,"Checker",(char (*) [9])pcVar16);
    break;
  case 4:
    pcVar16 = "BoundsChecker";
    goto LAB_001adce1;
  case 5:
    pcVar16 = "CudaSanitizer";
    goto LAB_001adce1;
  case 6:
    cmXMLWriter::Attribute<char[17]>(xml,"Checker",(char (*) [17])"AddressSanitizer");
    break;
  case 7:
    pcVar16 = "LeakSanitizer";
LAB_001adce1:
    cmXMLWriter::Attribute<char[14]>(xml,"Checker",(char (*) [14])pcVar16);
    break;
  case 8:
    pcVar16 = "ThreadSanitizer";
    goto LAB_001add11;
  case 9:
    pcVar16 = "MemorySanitizer";
LAB_001add11:
    cmXMLWriter::Attribute<char[16]>(xml,"Checker",(char (*) [16])pcVar16);
    break;
  case 10:
    cmXMLWriter::Attribute<char[27]>(xml,"Checker",(char (*) [27])"UndefinedBehaviorSanitizer");
    break;
  default:
    cmXMLWriter::Attribute<char[8]>(xml,"Checker",(char (*) [8])0x7aa445);
  }
  local_1d0._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"StartDateTime","");
  cmXMLWriter::StartElement(xml,(string *)local_1d0);
  cmXMLWriter::Content<std::__cxx11::string>(xml,&(this->super_cmCTestTestHandler).StartTest);
  cmXMLWriter::EndElement(xml);
  if ((pointer)local_1d0._0_8_ != pcVar4) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  local_1d0._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"StartTestTime","");
  cmXMLWriter::
  Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
            (xml,(string *)local_1d0,&(this->super_cmCTestTestHandler).StartTestTime);
  if ((pointer)local_1d0._0_8_ != pcVar4) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  local_1d0._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"TestList","");
  cmXMLWriter::StartElement(xml,(string *)local_1d0);
  local_200 = xml;
  if ((pointer)local_1d0._0_8_ != pcVar4) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  pcVar7 = local_200;
  pcVar19 = (this->super_cmCTestTestHandler).TestResults.
            super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar3 = (this->super_cmCTestTestHandler).TestResults.
           super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_228 = this;
  if (pcVar19 != pcVar3) {
    paVar2 = &local_248.field_2;
    do {
      pcVar4 = (pcVar19->Path)._M_dataplus._M_p;
      local_248._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_248,pcVar4,pcVar4 + (pcVar19->Path)._M_string_length);
      std::__cxx11::string::append((char *)&local_248);
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_248,(ulong)(pcVar19->Name)._M_dataplus._M_p);
      local_1d0._0_8_ = local_1d0 + 0x10;
      psVar14 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar14) {
        local_1d0._16_8_ = *psVar14;
        local_1d0._24_8_ = plVar10[3];
      }
      else {
        local_1d0._16_8_ = *psVar14;
        local_1d0._0_8_ = (size_type *)*plVar10;
      }
      local_1d0._8_8_ = plVar10[1];
      *plVar10 = (long)psVar14;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
      local_248._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Test","");
      cmCTest::GetShortPathToFile
                (&local_220,(local_228->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,
                 (string *)local_1d0);
      cmXMLWriter::StartElement(pcVar7,&local_248);
      cmXMLWriter::Content<std::__cxx11::string>(pcVar7,&local_220);
      cmXMLWriter::EndElement(pcVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
      }
      pcVar19 = pcVar19 + 1;
    } while (pcVar19 != pcVar3);
  }
  pcVar7 = local_200;
  cmXMLWriter::EndElement(local_200);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,"-- Processing memory checking output:\n",0x26);
  pcVar17 = local_228;
  pcVar5 = (local_228->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar5,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x169,local_248._M_dataplus._M_p,
               (pcVar17->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  std::ios_base::~ios_base(local_160);
  pcVar19 = (pcVar17->super_cmCTestTestHandler).TestResults.
            super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar11 = (long)(pcVar17->super_cmCTestTestHandler).TestResults.
                 super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar19;
  if (lVar11 != 0) {
    local_58 = (lVar11 >> 4) * -0x2c8590b21642c859;
    uVar20 = 0;
    do {
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      local_248._M_string_length = 0;
      local_248.field_2._M_local_buf[0] = '\0';
      local_1d0._0_8_ = local_1d0._0_8_ & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_1e8,
                 (long)(pcVar17->ResultStrings).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pcVar17->ResultStrings).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,
                 (value_type_conflict2 *)local_1d0,(allocator_type *)&local_220);
      pcVar19 = pcVar19 + uVar20;
      bVar8 = ProcessMemCheckOutput(pcVar17,&pcVar19->Output,&local_248,&local_1e8);
      local_1f8 = pcVar19;
      if (!bVar8 || pcVar19->Status != 9) {
        cmCTestTestHandler::CleanTestOutput
                  (&pcVar17->super_cmCTestTestHandler,&local_248,
                   (long)(pcVar17->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize,
                   (pcVar17->super_cmCTestTestHandler).TestOutputTruncation);
        cmCTestTestHandler::WriteTestResultHeader
                  (&pcVar17->super_cmCTestTestHandler,pcVar7,local_1f8);
        local_1d0._0_8_ = local_1d0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Results","");
        cmXMLWriter::StartElement(pcVar7,(string *)local_1d0);
        if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
          operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
        }
        local_1f0 = uVar20;
        if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          iVar18 = 0;
        }
        else {
          lVar11 = 0;
          uVar20 = 0;
          iVar18 = 0;
          piVar13 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar15 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          do {
            if (piVar13[uVar20] == 0) {
              iVar9 = 0;
            }
            else {
              local_1d0._0_8_ = local_1d0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Defect","");
              cmXMLWriter::StartElement(pcVar7,(string *)local_1d0);
              if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
                operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
              }
              cmXMLWriter::Attribute<std::__cxx11::string>
                        (pcVar7,"type",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&(((local_228->ResultStringsLong).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar11));
              piVar13 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              cmXMLWriter::PreContent(pcVar7);
              std::ostream::operator<<(pcVar7->Output,piVar13[uVar20]);
              iVar9 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar20];
              cmXMLWriter::EndElement(pcVar7);
              iVar18 = iVar18 + iVar9;
              iVar9 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar20];
              piVar13 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar15 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              pcVar17 = local_228;
            }
            piVar1 = (pcVar17->GlobalResults).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar20;
            *piVar1 = *piVar1 + iVar9;
            uVar20 = uVar20 + 1;
            lVar11 = lVar11 + 0x20;
          } while (uVar20 < (ulong)((long)piVar15 - (long)piVar13 >> 2));
        }
        cmXMLWriter::EndElement(pcVar7);
        uVar20 = local_1f0;
        if (0 < iVar18) {
          iVar9 = cmCTest::GetMaxTestNameWidth
                            ((pcVar17->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
          local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
          pcVar4 = (local_1f8->Name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_220,pcVar4,pcVar4 + (local_1f8->Name)._M_string_length);
          std::__cxx11::string::append((char *)&local_220);
          std::__cxx11::string::resize((ulong)&local_220,(char)iVar9 + '\x04');
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"/",1);
          poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12," MemCheck: #",0xc);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_1f8->TestCount);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,": ",2);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,local_220._M_dataplus._M_p,local_220._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"   Defects: ",0xc);
          plVar10 = (long *)std::ostream::operator<<(poVar12,iVar18);
          std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
          std::ostream::put((char)plVar10);
          std::ostream::flush();
          pcVar5 = (pcVar17->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar5,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                       ,399,(char *)local_50,
                       (pcVar17->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
          uVar20 = local_1f0;
          if (local_50 != local_40) {
            operator_delete(local_50,local_40[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
          std::ios_base::~ios_base(local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
        }
        local_1d0._0_8_ = local_1d0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Log","");
        cmXMLWriter::StartElement(pcVar7,(string *)local_1d0);
        if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
          operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
        }
        bVar8 = cmCTest::ShouldCompressTestOutput
                          ((pcVar17->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest);
        if (bVar8) {
          cmCTest::CompressString
                    ((pcVar17->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,
                     &local_248);
          cmXMLWriter::Attribute<char[5]>(pcVar7,"compression",(char (*) [5])0x7a6b07);
          cmXMLWriter::Attribute<char[7]>(pcVar7,"encoding",(char (*) [7])"base64");
        }
        cmXMLWriter::Content<std::__cxx11::string>(pcVar7,&local_248);
        cmXMLWriter::EndElement(pcVar7);
        cmCTestTestHandler::WriteTestResultFooter
                  (&pcVar17->super_cmCTestTestHandler,pcVar7,local_1f8);
      }
      if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
      uVar20 = uVar20 + 1;
      pcVar19 = (pcVar17->super_cmCTestTestHandler).TestResults.
                super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar20 < (ulong)(((long)(pcVar17->super_cmCTestTestHandler).TestResults.
                                     super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar19 >> 4
                              ) * -0x2c8590b21642c859));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,
             "MemCheck log files can be found here: (<#> corresponds to test number)",0x46);
  std::ios::widen((char)(ostringstream *)local_1d0 + (char)*(undefined8 *)(local_1d0._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_1d0);
  std::ostream::flush();
  pcVar5 = (pcVar17->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar5,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x1a0,local_248._M_dataplus._M_p,
               (pcVar17->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  std::ios_base::~ios_base(local_160);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  pcVar4 = (pcVar17->MemoryTesterOutputFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar4,pcVar4 + (pcVar17->MemoryTesterOutputFile)._M_string_length
            );
  cmsys::SystemTools::ReplaceString(&local_248,"??","<#>");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d0,local_248._M_dataplus._M_p,local_248._M_string_length);
  std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  pcVar5 = (pcVar17->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar5,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x1a4,local_220._M_dataplus._M_p,
               (pcVar17->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  std::ios_base::~ios_base(local_160);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,"Memory checking results:",0x18);
  std::ios::widen((char)(ostream *)local_1d0 + (char)*(undefined8 *)(local_1d0._0_8_ + -0x18));
  std::ostream::put((char)local_1d0);
  std::ostream::flush();
  pcVar5 = (pcVar17->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar5,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x1a6,local_220._M_dataplus._M_p,
               (pcVar17->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  std::ios_base::~ios_base(local_160);
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"DefectList","");
  cmXMLWriter::StartElement(pcVar7,(string *)local_1d0);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  piVar13 = (pcVar17->GlobalResults).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar15 = (pcVar17->GlobalResults).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (piVar15 != piVar13) {
    lVar11 = 0;
    uVar20 = 0;
    do {
      if (piVar13[uVar20] != 0) {
        *(undefined8 *)(SSL_CTX_set_alpn_protos + *(long *)(std::cerr + -0x18)) = 0x23;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        pbVar6 = (local_228->ResultStringsLong).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d0,
                             *(char **)((long)&(pbVar6->_M_dataplus)._M_p + lVar11),
                             *(long *)((long)&pbVar6->_M_string_length + lVar11));
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," - ",3);
        plVar10 = (long *)std::ostream::operator<<
                                    (poVar12,(local_228->GlobalResults).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[uVar20]);
        std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
        std::ostream::put((char)plVar10);
        std::ostream::flush();
        pcVar17 = local_228;
        pcVar5 = (local_228->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar5,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x1ae,local_220._M_dataplus._M_p,
                     (pcVar17->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        std::ios_base::~ios_base(local_160);
        local_1d0._0_8_ = local_1d0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Defect","");
        cmXMLWriter::StartElement(local_200,(string *)local_1d0);
        if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
          operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
        }
        pcVar7 = local_200;
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (local_200,"Type",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(((local_228->ResultStringsLong).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar11)
                  );
        cmXMLWriter::EndElement(pcVar7);
        piVar13 = (local_228->GlobalResults).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar15 = (local_228->GlobalResults).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar20 = uVar20 + 1;
      lVar11 = lVar11 + 0x20;
    } while (uVar20 < (ulong)((long)piVar15 - (long)piVar13 >> 2));
  }
  pcVar7 = local_200;
  cmXMLWriter::EndElement(local_200);
  pcVar17 = local_228;
  pcVar4 = local_1d0 + 0x10;
  local_1d0._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"EndDateTime","");
  cmXMLWriter::StartElement(pcVar7,(string *)local_1d0);
  cmXMLWriter::Content<std::__cxx11::string>(pcVar7,&(pcVar17->super_cmCTestTestHandler).EndTest);
  cmXMLWriter::EndElement(pcVar7);
  if ((pointer)local_1d0._0_8_ != pcVar4) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  local_1d0._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"EndTestTime","");
  cmXMLWriter::
  Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
            (pcVar7,(string *)local_1d0,&(pcVar17->super_cmCTestTestHandler).EndTestTime);
  if ((pointer)local_1d0._0_8_ != pcVar4) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  local_1d0._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"ElapsedMinutes","");
  local_220._M_dataplus._M_p =
       (pointer)(long)((pcVar17->super_cmCTestTestHandler).ElapsedTestingTime.__r / 60.0);
  cmXMLWriter::Element<long>(pcVar7,(string *)local_1d0,(long *)&local_220);
  if ((pointer)local_1d0._0_8_ != pcVar4) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  cmXMLWriter::EndElement(pcVar7);
  cmCTest::EndXML((pcVar17->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest,pcVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmCTestMemCheckHandler::GenerateCTestXML(cmXMLWriter& xml)
{
  if (!this->CTest->GetProduceXML()) {
    return;
  }
  this->CTest->StartXML(xml, this->AppendXML);
  this->CTest->GenerateSubprojectsOutput(xml);
  xml.StartElement("DynamicAnalysis");
  switch (this->MemoryTesterStyle) {
    case cmCTestMemCheckHandler::VALGRIND:
      xml.Attribute("Checker", "Valgrind");
      break;
    case cmCTestMemCheckHandler::DRMEMORY:
      xml.Attribute("Checker", "DrMemory");
      break;
    case cmCTestMemCheckHandler::PURIFY:
      xml.Attribute("Checker", "Purify");
      break;
    case cmCTestMemCheckHandler::BOUNDS_CHECKER:
      xml.Attribute("Checker", "BoundsChecker");
      break;
    case cmCTestMemCheckHandler::CUDA_SANITIZER:
      xml.Attribute("Checker", "CudaSanitizer");
      break;
    case cmCTestMemCheckHandler::ADDRESS_SANITIZER:
      xml.Attribute("Checker", "AddressSanitizer");
      break;
    case cmCTestMemCheckHandler::LEAK_SANITIZER:
      xml.Attribute("Checker", "LeakSanitizer");
      break;
    case cmCTestMemCheckHandler::THREAD_SANITIZER:
      xml.Attribute("Checker", "ThreadSanitizer");
      break;
    case cmCTestMemCheckHandler::MEMORY_SANITIZER:
      xml.Attribute("Checker", "MemorySanitizer");
      break;
    case cmCTestMemCheckHandler::UB_SANITIZER:
      xml.Attribute("Checker", "UndefinedBehaviorSanitizer");
      break;
    default:
      xml.Attribute("Checker", "Unknown");
  }

  xml.Element("StartDateTime", this->StartTest);
  xml.Element("StartTestTime", this->StartTestTime);
  xml.StartElement("TestList");
  cmCTestMemCheckHandler::TestResultsVector::size_type cc;
  for (cmCTestTestResult const& result : this->TestResults) {
    std::string testPath = result.Path + "/" + result.Name;
    xml.Element("Test", this->CTest->GetShortPathToFile(testPath));
  }
  xml.EndElement(); // TestList
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "-- Processing memory checking output:\n", this->Quiet);
  size_t total = this->TestResults.size();
  for (cc = 0; cc < this->TestResults.size(); cc++) {
    cmCTestTestResult const& result = this->TestResults[cc];
    std::string memcheckstr;
    std::vector<int> memcheckresults(this->ResultStrings.size(), 0);
    bool res =
      this->ProcessMemCheckOutput(result.Output, memcheckstr, memcheckresults);
    if (res && result.Status == cmCTestMemCheckHandler::COMPLETED) {
      continue;
    }
    this->CleanTestOutput(
      memcheckstr,
      static_cast<size_t>(this->CustomMaximumFailedTestOutputSize),
      this->TestOutputTruncation);
    this->WriteTestResultHeader(xml, result);
    xml.StartElement("Results");
    int memoryErrors = 0;
    for (std::vector<int>::size_type kk = 0; kk < memcheckresults.size();
         ++kk) {
      if (memcheckresults[kk]) {
        xml.StartElement("Defect");
        xml.Attribute("type", this->ResultStringsLong[kk]);
        xml.Content(memcheckresults[kk]);
        memoryErrors += memcheckresults[kk];
        xml.EndElement(); // Defect
      }
      this->GlobalResults[kk] += memcheckresults[kk];
    }
    xml.EndElement(); // Results
    if (memoryErrors > 0) {
      const int maxTestNameWidth = this->CTest->GetMaxTestNameWidth();
      std::string outname = result.Name + " ";
      outname.resize(maxTestNameWidth + 4, '.');
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         cc + 1 << "/" << total << " MemCheck: #"
                                << result.TestCount << ": " << outname
                                << "   Defects: " << memoryErrors << std::endl,
                         this->Quiet);
    }
    xml.StartElement("Log");
    if (this->CTest->ShouldCompressTestOutput()) {
      this->CTest->CompressString(memcheckstr);
      xml.Attribute("compression", "gzip");
      xml.Attribute("encoding", "base64");
    }
    xml.Content(memcheckstr);
    xml.EndElement(); // Log

    this->WriteTestResultFooter(xml, result);
  }
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "MemCheck log files can be found here: "
                     "(<#> corresponds to test number)"
                       << std::endl,
                     this->Quiet);
  std::string output = this->MemoryTesterOutputFile;
  cmSystemTools::ReplaceString(output, "??", "<#>");
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, output << std::endl,
                     this->Quiet);
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "Memory checking results:" << std::endl, this->Quiet);
  xml.StartElement("DefectList");
  for (cc = 0; cc < this->GlobalResults.size(); cc++) {
    if (this->GlobalResults[cc]) {
      std::cerr.width(35);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         this->ResultStringsLong[cc]
                           << " - " << this->GlobalResults[cc] << std::endl,
                         this->Quiet);
      xml.StartElement("Defect");
      xml.Attribute("Type", this->ResultStringsLong[cc]);
      xml.EndElement();
    }
  }
  xml.EndElement(); // DefectList

  xml.Element("EndDateTime", this->EndTest);
  xml.Element("EndTestTime", this->EndTestTime);
  xml.Element(
    "ElapsedMinutes",
    std::chrono::duration_cast<std::chrono::minutes>(this->ElapsedTestingTime)
      .count());

  xml.EndElement(); // DynamicAnalysis
  this->CTest->EndXML(xml);
}